

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void * qlist_new(void)

{
  t_object *owner;
  _outlet *p_Var1;
  t_pd p_Var2;
  _glist *p_Var3;
  _inlet *p_Var4;
  
  owner = (t_object *)pd_new(qlist_class);
  p_Var1 = (_outlet *)gensym("qlist");
  p_Var2 = (t_pd)binbuf_new();
  owner[1].te_g.g_pd = p_Var2;
  p_Var3 = canvas_getcurrent();
  owner[1].te_g.g_next = (_gobj *)p_Var3;
  owner[1].te_outlet = p_Var1;
  p_Var2 = (t_pd)clock_new(owner,qlist_tick);
  owner[2].te_g.g_pd = p_Var2;
  outlet_new(owner,&s_list);
  p_Var4 = (_inlet *)outlet_new(owner,&s_bang);
  owner[1].te_inlet = p_Var4;
  owner[1].te_xpix = -1;
  owner[1].te_ypix = 0x7fff;
  *(undefined4 *)&owner[2].te_g.g_next = 0x3f800000;
  owner[2].te_binbuf = (_binbuf *)0x0;
  owner[2].te_outlet = (_outlet *)0x0;
  *(undefined4 *)&owner[2].te_inlet = 0;
  return owner;
}

Assistant:

static void *qlist_new(void)
{
    t_qlist *x = (t_qlist *)pd_new(qlist_class);
    textbuf_init(&x->x_textbuf, gensym("qlist"));
    x->x_clock = clock_new(x, (t_method)qlist_tick);
    outlet_new(&x->x_ob, &s_list);
    x->x_bangout = outlet_new(&x->x_ob, &s_bang);
    x->x_onset = 0x7fffffff;
    x->x_tempo = 1;
    x->x_whenclockset = 0;
    x->x_clockdelay = 0;
    x->x_rewound = x->x_innext = 0;
    return (x);
}